

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::generateTableDecl(CodegenVisitor *this,TableDecl *tableDecl)

{
  TableMember *pTVar1;
  Node *n;
  SQFuncState *this_00;
  SQInteger arg3;
  SQInteger arg2;
  SQInteger SVar2;
  SQInteger arg1;
  Expr *obj;
  ulong arg0;
  TreeOp TVar3;
  SQOpcode _op;
  long line;
  long lVar4;
  bool bVar5;
  SQInteger local_80;
  undefined1 local_78 [8];
  SQObjectValue SStack_70;
  TreeOp local_60;
  TreeOp local_5c;
  TableDecl *local_58;
  ulong local_50;
  ArenaVector<SQCompilation::Expr_*> memberConstantKeys;
  
  TVar3 = (tableDecl->super_Decl).super_Statement.super_Node._op;
  memberConstantKeys._arena = this->_arena;
  memberConstantKeys._vals = (Expr **)0x0;
  memberConstantKeys._size = 0;
  memberConstantKeys._allocated = 0;
  lVar4 = 0;
  local_60 = TVar3;
  local_58 = tableDecl;
  for (local_50 = 0; local_50 < (local_58->_members)._size; local_50 = local_50 + 1) {
    pTVar1 = (local_58->_members)._vals;
    obj = *(Expr **)((long)&pTVar1->key + lVar4);
    if ((local_50 < 100) && (line = (long)(obj->super_Node)._coordinates.lineStart, line != -1)) {
      SQFuncState::AddLineInfos(this->_fs,line,false,false);
      obj = *(Expr **)((long)&pTVar1->key + lVar4);
    }
    CheckMemberUniqueness(this,&memberConstantKeys,obj);
    n = *(Node **)((long)&pTVar1->key + lVar4);
    local_5c = n->_op;
    bVar5 = local_5c != TO_LITERAL;
    if (bVar5 || TVar3 == TO_CLASS) {
      visitForceGet(this,n);
    }
    else {
      switch(*(undefined4 *)&n->field_0x1c) {
      case 0:
        this_00 = this->_fs;
        _local_78 = SQFuncState::CreateString
                              (this_00,(SQChar *)n[1].super_ArenaObj._vptr_ArenaObj,-1);
        local_80 = SQFuncState::GetConstant(this_00,(SQObject *)local_78,0x7fffffff);
        break;
      case 1:
        local_80 = SQFuncState::GetNumericConstant
                             (this->_fs,(SQInteger)n[1].super_ArenaObj._vptr_ArenaObj);
        break;
      case 2:
        local_80 = SQFuncState::GetNumericConstant
                             (this->_fs,*(SQFloat *)&n[1].super_ArenaObj._vptr_ArenaObj);
        break;
      case 3:
        stack0xffffffffffffff8c = ZEXT412(0);
        local_78._0_4_ = OT_BOOL;
        if (*(char *)&n[1].super_ArenaObj._vptr_ArenaObj == '\x01') {
          SStack_70.nInteger = 1;
        }
        local_80 = SQFuncState::GetConstant(this->_fs,(SQObject *)local_78,0x7fffffff);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_78);
      }
    }
    visitForceGet(this,*(Node **)((long)&pTVar1->value + lVar4));
    arg3 = SQFuncState::PopTarget(this->_fs);
    arg2 = local_80;
    if (bVar5 || TVar3 == TO_CLASS) {
      arg2 = SQFuncState::PopTarget(this->_fs);
    }
    SVar2 = SQFuncState::TopTarget(this->_fs);
    TVar3 = local_60;
    if (local_60 == TO_CLASS) {
      arg0 = (ulong)(*(int *)((long)&pTVar1->flags + lVar4) * 2 & 2);
      _op = _OP_NEWSLOTA;
      arg1 = SVar2;
    }
    else {
      _op = (local_5c == TO_LITERAL) + _OP_NEWSLOT;
      arg0 = 0xff;
      arg1 = arg2;
      arg2 = SVar2;
    }
    SQFuncState::AddInstruction(this->_fs,_op,arg0,arg1,arg2,arg3);
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

void CodegenVisitor::generateTableDecl(TableDecl *tableDecl) {
    bool isKlass = tableDecl->op() == TO_CLASS;
    const auto &members = tableDecl->members();

    ArenaVector<Expr *> memberConstantKeys(_arena);

    for (SQUnsignedInteger i = 0; i < members.size(); ++i) {
        const TableMember &m = members[i];
#if SQ_LINE_INFO_IN_STRUCTURES
        if (i < 100 && m.key->lineStart() != -1) {
            _fs->AddLineInfos(m.key->lineStart(), false, false);
        }
#endif
        CheckMemberUniqueness(memberConstantKeys, m.key);

        bool isConstKey = m.key->op() == TO_LITERAL && !isKlass;
        SQInteger constantI;
        if (isConstKey)
        {
          switch(m.key->asLiteral()->kind())
          {
            case LK_STRING: constantI = _fs->GetConstant(_fs->CreateString(m.key->asLiteral()->s())); break;
            case LK_INT: constantI = _fs->GetNumericConstant(m.key->asLiteral()->i()); break;
            case LK_FLOAT: constantI = _fs->GetNumericConstant(m.key->asLiteral()->f()); break;
            case LK_BOOL: constantI = _fs->GetConstant(SQObjectPtr(m.key->asLiteral()->b())); break;
            default:case LK_NULL: assert(0); break;
          }
          //isConstKey = constantI < 256; // since currently we store in arg1, it is sufficient
        }

        if (!isConstKey)
          visitForceGet(m.key);
        visitForceGet(m.value);

        SQInteger val = _fs->PopTarget();
        SQInteger key = isConstKey ? constantI : _fs->PopTarget();
        SQInteger table = _fs->TopTarget(); //<<BECAUSE OF THIS NO COMMON EMIT FUNC IS POSSIBLE
        assert(table < 256);

        if (isKlass) {
            _fs->AddInstruction(_OP_NEWSLOTA, m.isStatic() ? NEW_SLOT_STATIC_FLAG : 0, table, key, val);
        }
        else {
            _fs->AddInstruction(isConstKey ? _OP_NEWSLOTK : _OP_NEWSLOT, 0xFF, key, table, val);
        }
    }
}